

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

MethodPrototypeSymbol *
slang::ast::MethodPrototypeSymbol::fromSyntax(Scope *scope,ExternInterfaceMethodSyntax *syntax)

{
  bool bVar1;
  MethodPrototypeSymbol *pMVar2;
  MethodPrototypeSymbol *result;
  ExternInterfaceMethodSyntax *in_stack_000000d8;
  Scope *in_stack_000000e0;
  Scope *in_stack_000000f8;
  undefined1 in_stack_00000100 [16];
  DiagCode in_stack_00000114;
  bitmask<slang::ast::MethodFlags> local_32;
  SourceRange local_30;
  undefined4 in_stack_ffffffffffffffe0;
  
  pMVar2 = createExternIfaceMethod<slang::syntax::ExternInterfaceMethodSyntax>
                     (in_stack_000000e0,in_stack_000000d8);
  bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x10ba3b0);
  if (bVar1) {
    if (pMVar2->subroutineKind == Function) {
      local_30 = parsing::Token::range((Token *)CONCAT44(0x3a0006,in_stack_ffffffffffffffe0));
      Scope::addDiag(in_stack_000000f8,in_stack_00000114,(SourceRange)in_stack_00000100);
    }
    else {
      bitmask<slang::ast::MethodFlags>::bitmask(&local_32,ForkJoin);
      bitmask<slang::ast::MethodFlags>::operator|=(&pMVar2->flags,&local_32);
    }
  }
  return pMVar2;
}

Assistant:

MethodPrototypeSymbol& MethodPrototypeSymbol::fromSyntax(
    const Scope& scope, const ExternInterfaceMethodSyntax& syntax) {

    auto& result = createExternIfaceMethod(scope, syntax);
    if (syntax.forkJoin) {
        if (result.subroutineKind == SubroutineKind::Function)
            scope.addDiag(diag::ExternFuncForkJoin, syntax.forkJoin.range());
        else
            result.flags |= MethodFlags::ForkJoin;
    }

    return result;
}